

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec-ops.c
# Opt level: O2

axbStatus_t
test(axbVec_s *x0,axbVec_s *x1,axbVec_s *x2,axbVec_s *x3,axbScalar_s *alpha,axbScalar_s *beta,
    axbScalar_s *gamma,double *y0,double *y1,double *y2,double *y3,double a,double b,double c)

{
  axbVec_s *paVar1;
  double *pdVar2;
  axbVec_s *paVar3;
  double dVar4;
  ulong uVar5;
  axbStatus_t aVar6;
  size_t i_11;
  ulong uVar7;
  size_t sVar8;
  char *__format;
  ulong uVar9;
  double dVar10;
  undefined8 uStack_f0;
  size_t n;
  axbVec_s *local_d8;
  double *local_d0;
  axbVec_s *local_c8;
  double a_local;
  double local_b8;
  axbScalar_s *local_b0;
  double local_a8;
  double dStack_a0;
  size_t idx0;
  double c_local;
  double b_local;
  axbVec_s *local_78;
  axbVec_s *local_70;
  axbScalar_s *scalars [3];
  axbVec_s *vecs [3];
  
  local_d8 = x1;
  local_c8 = x2;
  a_local = a;
  local_b0 = beta;
  c_local = c;
  b_local = b;
  aVar6 = axbVecGetSize(x1,&n);
  if (aVar6 == 0) {
    local_d0 = (double *)malloc(n << 3);
    local_b8 = 0.0;
    aVar6 = axbVecSet(x0,alpha);
    if (aVar6 == 0) {
      for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
        y0[sVar8] = a_local;
      }
      local_70 = x3;
      check_equal(x0,y0,local_d0,"axbVecSet");
      aVar6 = axbVecSqrtAbs(x0);
      if (aVar6 == 0) {
        for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
          y0[sVar8] = SQRT(ABS(y0[sVar8]));
        }
        check_equal(x0,y0,local_d0,"axbVecSqrtAbs");
        aVar6 = axbVecZero(x0);
        if (aVar6 == 0) {
          for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
            y0[sVar8] = 0.0;
          }
          check_equal(x0,y0,local_d0,"axbVecZero");
          aVar6 = axbVecScale(local_d8,alpha);
          paVar1 = local_d8;
          if (aVar6 == 0) {
            for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
              y1[sVar8] = y1[sVar8] * a_local;
            }
            check_equal(local_d8,y1,local_d0,"axbVecScale");
            aVar6 = axbVecSum(paVar1,alpha);
            if (aVar6 == 0) {
              dVar10 = 0.0;
              for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
                dVar10 = dVar10 + y1[sVar8];
              }
              check_equal_scalar(alpha,dVar10,"axbVecSum");
              aVar6 = axbVecDot(local_d8,local_c8,alpha);
              if (aVar6 == 0) {
                dVar10 = 0.0;
                for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
                  dVar10 = dVar10 + y1[sVar8] * y2[sVar8];
                }
                check_equal_scalar(alpha,dVar10,"axbVecDot");
                aVar6 = axbVecTDot(local_d8,local_c8,alpha);
                if (aVar6 == 0) {
                  dVar10 = 0.0;
                  for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
                    dVar10 = dVar10 + y1[sVar8] * y2[sVar8];
                  }
                  check_equal_scalar(alpha,dVar10,"axbVecTDot");
                  aVar6 = axbVecNorm1(local_d8,alpha);
                  if (aVar6 == 0) {
                    dVar10 = 0.0;
                    for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
                      dVar10 = dVar10 + ABS(y1[sVar8]);
                    }
                    check_equal_scalar(alpha,dVar10,"axbVecNorm1");
                    aVar6 = axbVecNorm2(local_d8,alpha);
                    if (aVar6 == 0) {
                      dVar10 = 0.0;
                      for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
                        dVar10 = dVar10 + y1[sVar8] * y1[sVar8];
                      }
                      if (dVar10 < 0.0) {
                        dVar10 = sqrt(dVar10);
                      }
                      else {
                        dVar10 = SQRT(dVar10);
                      }
                      check_equal_scalar(alpha,dVar10,"axbVecNorm2");
                      aVar6 = axbVecNormInf(local_d8,alpha);
                      if (aVar6 == 0) {
                        dVar10 = 0.0;
                        for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
                          dVar4 = ABS(y1[sVar8]);
                          if (ABS(y1[sVar8]) <= dVar10) {
                            dVar4 = dVar10;
                          }
                          dVar10 = dVar4;
                        }
                        check_equal_scalar(alpha,dVar10,"axbVecNormInf");
                        aVar6 = axbVecDotNorm2(local_d8,local_c8,alpha,local_b0);
                        if (aVar6 == 0) {
                          local_b8 = 0.0;
                          dStack_a0 = 0.0;
                          for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
                            dVar10 = y2[sVar8];
                            local_b8 = local_b8 + dVar10 * y1[sVar8];
                            dStack_a0 = dStack_a0 + dVar10 * dVar10;
                          }
                          local_a8 = local_b8;
                          check_equal_scalar(alpha,local_b8,"axbVecDotNorm2, alpha");
                          if (dStack_a0 < 0.0) {
                            dVar10 = sqrt(dStack_a0);
                          }
                          else {
                            dVar10 = SQRT(dStack_a0);
                          }
                          check_equal_scalar(local_b0,dVar10,"axbVecDotNorm2, beta");
                          idx0 = 0;
                          aVar6 = axbVecMax(local_d8,&idx0,alpha);
                          if (aVar6 == 0) {
                            uVar9 = 0;
                            local_a8 = *y1;
                            for (uVar7 = 1; uVar7 < n; uVar7 = uVar7 + 1) {
                              dVar10 = y1[uVar7];
                              uVar5 = uVar7;
                              if (dVar10 <= local_a8) {
                                dVar10 = local_a8;
                                uVar5 = uVar9;
                              }
                              uVar9 = uVar5;
                              local_a8 = dVar10;
                            }
                            local_78 = x0;
                            aVar6 = axbScalarGetValue(alpha,&local_b8,AXB_REAL_DOUBLE);
                            if (aVar6 == 0) {
                              if (idx0 != uVar9) {
                                __format = 
                                "ERROR: index mismatch for axbVecMax: %ld (%g) vs. %ld (%g)\n";
LAB_001049cf:
                                fprintf(_stderr,__format,local_b8,local_a8,idx0,uVar9);
                                exit(1);
                              }
                              check_equal_scalar(alpha,local_a8,"axbVecMax");
                              idx0 = 0;
                              aVar6 = axbVecMin(local_d8,&idx0,alpha);
                              if (aVar6 == 0) {
                                uVar9 = 0;
                                local_a8 = *y1;
                                for (uVar7 = 1; uVar7 < n; uVar7 = uVar7 + 1) {
                                  dVar10 = y1[uVar7];
                                  uVar5 = uVar7;
                                  if (local_a8 <= dVar10) {
                                    dVar10 = local_a8;
                                    uVar5 = uVar9;
                                  }
                                  uVar9 = uVar5;
                                  local_a8 = dVar10;
                                }
                                aVar6 = axbScalarGetValue(alpha,&local_b8,AXB_REAL_DOUBLE);
                                if (aVar6 == 0) {
                                  if (idx0 != uVar9) {
                                    __format = 
                                    "ERROR: index mismatch for axbVecMin: %ld (%g) vs. %ld (%g)\n";
                                    goto LAB_001049cf;
                                  }
                                  check_equal_scalar(alpha,local_a8,"axbVecMin");
                                  paVar1 = local_78;
                                  aVar6 = axbVecCopy(local_d8,local_78);
                                  pdVar2 = local_d0;
                                  if (aVar6 == 0) {
                                    for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
                                      y0[sVar8] = y1[sVar8];
                                    }
                                    check_equal(paVar1,y0,local_d0,"axbVecCopy, x0");
                                    check_equal(local_d8,y1,pdVar2,"axbVecCopy, x1");
                                    aVar6 = axbVecSwap(paVar1,local_c8);
                                    pdVar2 = local_d0;
                                    if (aVar6 == 0) {
                                      for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
                                        dVar10 = y0[sVar8];
                                        y0[sVar8] = y2[sVar8];
                                        y2[sVar8] = dVar10;
                                      }
                                      check_equal(paVar1,y0,local_d0,"axbVecSwap, x0");
                                      check_equal(local_c8,y2,pdVar2,"axbVecSwap, x2");
                                      aVar6 = axbScalarGetValue(alpha,&a_local,AXB_REAL_DOUBLE);
                                      if (aVar6 == 0) {
                                        aVar6 = axbScalarGetValue(local_b0,&b_local,AXB_REAL_DOUBLE)
                                        ;
                                        if (aVar6 == 0) {
                                          aVar6 = axbScalarGetValue(gamma,&c_local,AXB_REAL_DOUBLE);
                                          if (aVar6 == 0) {
                                            aVar6 = axbVecAXPY(paVar1,alpha,local_d8);
                                            if (aVar6 == 0) {
                                              for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
                                                y0[sVar8] = y1[sVar8] * a_local + y0[sVar8];
                                              }
                                              check_equal(paVar1,y0,local_d0,"axbVecAXPY");
                                              aVar6 = axbVecAYPX(paVar1,alpha,local_d8);
                                              if (aVar6 == 0) {
                                                for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
                                                  y0[sVar8] = y0[sVar8] * a_local + y1[sVar8];
                                                }
                                                check_equal(paVar1,y0,local_d0,"axbVecAYPX");
                                                aVar6 = axbVecAXPBYPCZ(local_c8,alpha,local_b0,gamma
                                                                       ,paVar1,local_d8);
                                                paVar3 = local_c8;
                                                if (aVar6 == 0) {
                                                  for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
                                                    y2[sVar8] = y2[sVar8] * c_local +
                                                                y0[sVar8] * a_local +
                                                                y1[sVar8] * b_local;
                                                  }
                                                  check_equal(local_c8,y2,local_d0,"axbVecAXPBYPCZ")
                                                  ;
                                                  aVar6 = axbVecWAXPY(paVar3,alpha,paVar1,local_d8);
                                                  paVar3 = local_c8;
                                                  if (aVar6 == 0) {
                                                    for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1) {
                                                      y2[sVar8] = y0[sVar8] * a_local + y1[sVar8];
                                                    }
                                                    check_equal(local_c8,y2,local_d0,"axbVecWAXPY");
                                                    vecs[0] = local_d8;
                                                    vecs[1] = paVar3;
                                                    vecs[2] = local_70;
                                                    scalars[1] = local_b0;
                                                    scalars[2] = gamma;
                                                    scalars[0] = alpha;
                                                    aVar6 = axbVecMAXPY(paVar1,3,scalars,vecs);
                                                    if (aVar6 == 0) {
                                                      for (sVar8 = 0; n != sVar8; sVar8 = sVar8 + 1)
                                                      {
                                                        y0[sVar8] = y3[sVar8] * c_local +
                                                                    y1[sVar8] * a_local +
                                                                    y2[sVar8] * b_local + y0[sVar8];
                                                      }
                                                      check_equal(paVar1,y0,local_d0,"axbVecMAXPY");
                                                      aVar6 = axbVecPointwiseMult(paVar1,local_d8,
                                                                                  local_c8);
                                                      if (aVar6 == 0) {
                                                        for (sVar8 = 0; n != sVar8;
                                                            sVar8 = sVar8 + 1) {
                                                          y0[sVar8] = y1[sVar8] * y2[sVar8];
                                                        }
                                                        check_equal(paVar1,y0,local_d0,
                                                                    "axbVecPointwiseMult");
                                                        aVar6 = axbVecPointwiseDivide
                                                                          (paVar1,local_d8,local_c8)
                                                        ;
                                                        pdVar2 = local_d0;
                                                        if (aVar6 == 0) {
                                                          for (sVar8 = 0; n != sVar8;
                                                              sVar8 = sVar8 + 1) {
                                                            y0[sVar8] = y1[sVar8] / y2[sVar8];
                                                          }
                                                          check_equal(paVar1,y0,local_d0,
                                                                      "axbVecPointwiseDivide");
                                                          free(pdVar2);
                                                          return 0;
                                                        }
                                                        uStack_f0 = 0xb4;
                                                      }
                                                      else {
                                                        uStack_f0 = 0xaf;
                                                      }
                                                    }
                                                    else {
                                                      uStack_f0 = 0xaa;
                                                    }
                                                  }
                                                  else {
                                                    uStack_f0 = 0xa3;
                                                  }
                                                }
                                                else {
                                                  uStack_f0 = 0x9e;
                                                }
                                              }
                                              else {
                                                uStack_f0 = 0x99;
                                              }
                                            }
                                            else {
                                              uStack_f0 = 0x94;
                                            }
                                          }
                                          else {
                                            uStack_f0 = 0x91;
                                          }
                                        }
                                        else {
                                          uStack_f0 = 0x90;
                                        }
                                      }
                                      else {
                                        uStack_f0 = 0x8f;
                                      }
                                    }
                                    else {
                                      uStack_f0 = 0x8a;
                                    }
                                  }
                                  else {
                                    uStack_f0 = 0x84;
                                  }
                                }
                                else {
                                  uStack_f0 = 0x79;
                                }
                              }
                              else {
                                uStack_f0 = 0x73;
                              }
                            }
                            else {
                              uStack_f0 = 0x6d;
                            }
                          }
                          else {
                            uStack_f0 = 0x67;
                          }
                        }
                        else {
                          uStack_f0 = 0x5e;
                        }
                      }
                      else {
                        uStack_f0 = 0x58;
                      }
                    }
                    else {
                      uStack_f0 = 0x52;
                    }
                  }
                  else {
                    uStack_f0 = 0x4c;
                  }
                }
                else {
                  uStack_f0 = 0x43;
                }
              }
              else {
                uStack_f0 = 0x3d;
              }
            }
            else {
              uStack_f0 = 0x36;
            }
          }
          else {
            uStack_f0 = 0x2b;
          }
        }
        else {
          uStack_f0 = 0x26;
        }
      }
      else {
        uStack_f0 = 0x21;
      }
    }
    else {
      uStack_f0 = 0x1c;
    }
  }
  else {
    uStack_f0 = 0x10;
  }
  fprintf(_stderr,"Failure in line %d in file %s\n",uStack_f0,
          "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
         );
  return aVar6;
}

Assistant:

axbStatus_t test(struct axbVec_s *x0, struct axbVec_s *x1, struct axbVec_s *x2, struct axbVec_s *x3, struct axbScalar_s *alpha, struct axbScalar_s *beta, struct axbScalar_s *gamma,
                 double *y0, double *y1, double *y2, double *y3, double a, double b, double c)
{
  size_t n;
  AXB_ERR_CHECK(axbVecGetSize(x1, &n));
  double *temp = malloc(sizeof(double) * n);
  double t = 0;
  double s = 0;



  //
  // in-place operations
  //

  // AXB_OP_VEC_SET
  AXB_ERR_CHECK(axbVecSet(x0, alpha));
  for (size_t i=0; i<n; ++i) y0[i] = a;
  check_equal(x0, y0, temp, "axbVecSet");

  // AXB_OP_VEC_SQRTABS
  AXB_ERR_CHECK(axbVecSqrtAbs(x0));
  for (size_t i=0; i<n; ++i) y0[i] = sqrt(fabs(y0[i]));
  check_equal(x0, y0, temp, "axbVecSqrtAbs");

  // AXB_OP_VEC_ZERO
  AXB_ERR_CHECK(axbVecZero(x0));
  for (size_t i=0; i<n; ++i) y0[i] = 0;
  check_equal(x0, y0, temp, "axbVecZero");

  // AXB_OP_VEC_SCALE
  AXB_ERR_CHECK(axbVecScale(x1, alpha));
  for (size_t i=0; i<n; ++i) y1[i] *= a;
  check_equal(x1, y1, temp, "axbVecScale");



  //
  // reduction operations
  //

  //AXB_OP_VEC_SUM
  AXB_ERR_CHECK(axbVecSum(x1, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += y1[i];
  check_equal_scalar(alpha, t, "axbVecSum");


  //AXB_OP_VEC_DOT
  AXB_ERR_CHECK(axbVecDot(x1, x2, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += y1[i] * y2[i];
  check_equal_scalar(alpha, t, "axbVecDot");

  //AXB_OP_VEC_TDOT
  AXB_ERR_CHECK(axbVecTDot(x1, x2, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += y1[i] * y2[i];
  check_equal_scalar(alpha, t, "axbVecTDot");

  //AXB_OP_VEC_MDOT
  // skipping: tested separately

  //AXB_OP_VEC_NORM1
  AXB_ERR_CHECK(axbVecNorm1(x1, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += fabs(y1[i]);
  check_equal_scalar(alpha, t, "axbVecNorm1");

  //AXB_OP_VEC_NORM2
  AXB_ERR_CHECK(axbVecNorm2(x1, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t += y1[i] * y1[i];
  check_equal_scalar(alpha, sqrt(t), "axbVecNorm2");

  //AXB_OP_VEC_NORMINF
  AXB_ERR_CHECK(axbVecNormInf(x1, alpha));
  t=0;
  for (size_t i=0; i<n; ++i) t = fabs(y1[i]) > t ? fabs(y1[i]) : t;
  check_equal_scalar(alpha, t, "axbVecNormInf");

  //AXB_OP_VEC_DOTNORM2
  AXB_ERR_CHECK(axbVecDotNorm2(x1, x2, alpha, beta));
  t=0;
  s=0;
  for (size_t i=0; i<n; ++i) { s += y1[i] * y2[i]; t += y2[i] * y2[i]; }
  check_equal_scalar(alpha, s, "axbVecDotNorm2, alpha");
  check_equal_scalar(beta, sqrt(t), "axbVecDotNorm2, beta");

  //AXB_OP_VEC_MAX
  size_t idx0 = 0;
  AXB_ERR_CHECK(axbVecMax(x1, &idx0, alpha));
  t=y1[0];
  size_t idx1 = 0;
  for (size_t i=1; i<n; ++i) {
    if (y1[i] > t) { idx1 = i; t = y1[i]; }
  }
  AXB_ERR_CHECK(axbScalarGetValue(alpha, &s, AXB_REAL_DOUBLE));
  if (idx0 != idx1) { fprintf(stderr, "ERROR: index mismatch for axbVecMax: %ld (%g) vs. %ld (%g)\n", idx0, s, idx1, t); exit(EXIT_FAILURE); }
  check_equal_scalar(alpha, t, "axbVecMax");

  //AXB_OP_VEC_MIN
  idx0 = 0;
  AXB_ERR_CHECK(axbVecMin(x1, &idx0, alpha));
  t=y1[0];
  idx1 = 0;
  for (size_t i=1; i<n; ++i) {
    if (y1[i] < t) { idx1 = i; t = y1[i]; }
  }
  AXB_ERR_CHECK(axbScalarGetValue(alpha, &s, AXB_REAL_DOUBLE));
  if (idx0 != idx1) { fprintf(stderr, "ERROR: index mismatch for axbVecMin: %ld (%g) vs. %ld (%g)\n", idx0, s, idx1, t); exit(EXIT_FAILURE); }
  check_equal_scalar(alpha, t, "axbVecMin");



  //
  // vector-vector operations
  //

  //AXB_OP_VEC_COPY
  AXB_ERR_CHECK(axbVecCopy(x1, x0));
  for (size_t i=0; i<n; ++i) y0[i] = y1[i];
  check_equal(x0, y0, temp, "axbVecCopy, x0");
  check_equal(x1, y1, temp, "axbVecCopy, x1");

  //AXB_OP_VEC_SWAP
  AXB_ERR_CHECK(axbVecSwap(x0, x2));
  for (size_t i=0; i<n; ++i) { t = y0[i]; y0[i] = y2[i]; y2[i] = t; }
  check_equal(x0, y0, temp, "axbVecSwap, x0");
  check_equal(x2, y2, temp, "axbVecSwap, x2");

  AXB_ERR_CHECK(axbScalarGetValue(alpha, &a, AXB_REAL_DOUBLE));  // reset
  AXB_ERR_CHECK(axbScalarGetValue(beta,  &b, AXB_REAL_DOUBLE));  // reset
  AXB_ERR_CHECK(axbScalarGetValue(gamma, &c, AXB_REAL_DOUBLE));  // reset

  //AXB_OP_VEC_AXPY
  AXB_ERR_CHECK(axbVecAXPY(x0, alpha, x1));
  for (size_t i=0; i<n; ++i) y0[i] += a * y1[i];
  check_equal(x0, y0, temp, "axbVecAXPY");

  //AXB_OP_VEC_AYPX
  AXB_ERR_CHECK(axbVecAYPX(x0, alpha, x1));
  for (size_t i=0; i<n; ++i) y0[i] = a * y0[i] + y1[i];
  check_equal(x0, y0, temp, "axbVecAYPX");

  //AXB_OP_VEC_AXPBYPCZ
  AXB_ERR_CHECK(axbVecAXPBYPCZ(x2, alpha, beta, gamma, x0, x1));
  for (size_t i=0; i<n; ++i) y2[i] = a * y0[i] + b * y1[i] + c * y2[i];
  check_equal(x2, y2, temp, "axbVecAXPBYPCZ");

  //AXB_OP_VEC_WAXPY
  AXB_ERR_CHECK(axbVecWAXPY(x2, alpha, x0, x1));
  for (size_t i=0; i<n; ++i) y2[i] = a * y0[i] + y1[i];
  check_equal(x2, y2, temp, "axbVecWAXPY");

  //AXB_OP_VEC_MAXPY
  struct axbVec_s *vecs[3] = {x1, x2, x3};
  struct axbScalar_s *scalars[3] = {alpha, beta, gamma};
  AXB_ERR_CHECK(axbVecMAXPY(x0, 3, (const struct axbScalar_s * const*)scalars, (const struct axbVec_s * const*)vecs));
  for (size_t i=0; i<n; ++i) y0[i] += a * y1[i] + b * y2[i] + c * y3[i];
  check_equal(x0, y0, temp, "axbVecMAXPY");

  //AXB_OP_VEC_POINTWISEMULT
  AXB_ERR_CHECK(axbVecPointwiseMult(x0, x1, x2));
  for (size_t i=0; i<n; ++i) y0[i] = y1[i] * y2[i];
  check_equal(x0, y0, temp, "axbVecPointwiseMult");

  //AXB_OP_VEC_POINTWISEDIV
  AXB_ERR_CHECK(axbVecPointwiseDivide(x0, x1, x2));
  for (size_t i=0; i<n; ++i) y0[i] = y1[i] / y2[i];
  check_equal(x0, y0, temp, "axbVecPointwiseDivide");

  free(temp);
  return 0;
}